

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classic_Emu.cpp
# Opt level: O0

void __thiscall Classic_Emu::Classic_Emu(Classic_Emu *this)

{
  undefined8 *in_RDI;
  Music_Emu *unaff_retaddr;
  
  Music_Emu::Music_Emu(unaff_retaddr);
  *in_RDI = &PTR__Classic_Emu_00a118a0;
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x38] = 0;
  return;
}

Assistant:

Classic_Emu::Classic_Emu()
{
	buf           = 0;
	stereo_buffer = 0;
	voice_types   = 0;
	
	// avoid inconsistency in our duplicated constants
	assert( (int) wave_type  == (int) Multi_Buffer::wave_type );
	assert( (int) noise_type == (int) Multi_Buffer::noise_type );
	assert( (int) mixed_type == (int) Multi_Buffer::mixed_type );
}